

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImGuiTextBuffer::ImGuiTextBuffer(ImGuiTextBuffer *this)

{
  int *piVar1;
  int iVar2;
  char *__dest;
  ImGuiContext *pIVar3;
  char *pcVar4;
  
  (this->Buf).Size = 0;
  (this->Buf).Capacity = 0;
  (this->Buf).Data = (char *)0x0;
  pIVar3 = GImGui;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (char *)(*(pIVar3->IO).MemAllocFn)(8);
  pcVar4 = (this->Buf).Data;
  if (pcVar4 != (char *)0x0) {
    memcpy(__dest,pcVar4,(long)(this->Buf).Size);
    pIVar3 = GImGui;
    pcVar4 = (this->Buf).Data;
    if (pcVar4 != (char *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      goto LAB_0013c3b3;
    }
  }
  pcVar4 = (char *)0x0;
  pIVar3 = GImGui;
LAB_0013c3b3:
  (*(pIVar3->IO).MemFreeFn)(pcVar4);
  (this->Buf).Data = __dest;
  (this->Buf).Capacity = 8;
  iVar2 = (this->Buf).Size;
  (this->Buf).Size = iVar2 + 1;
  __dest[iVar2] = '\0';
  return;
}

Assistant:

ImGuiTextBuffer()   { Buf.push_back(0); }